

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfa_extract.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  char *pcVar3;
  const_reference __source;
  long lVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  undefined1 local_b8 [8];
  path output_dir;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  path local_80;
  undefined1 local_58 [8];
  string_view entry_data;
  shared_ptr<mg::fs::MappedFile> hfa_data;
  unique_ptr<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>_> hfa;
  
  pcVar3 = (char *)0x0;
  pcVar7 = (char *)0x0;
  for (lVar4 = 1; lVar4 < argc; lVar4 = lVar4 + 1) {
    if (pcVar3 == (char *)0x0) {
      pcVar3 = argv[lVar4];
    }
    else {
      if (pcVar7 != (char *)0x0) goto LAB_001045f4;
      pcVar7 = argv[lVar4];
    }
  }
  if (pcVar3 != (char *)0x0) {
    mg::fs::MappedFile::open((char *)&local_80,(int)pcVar3);
    std::__shared_ptr<mg::fs::MappedFile,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>,void>
              ((__shared_ptr<mg::fs::MappedFile,(__gnu_cxx::_Lock_policy)2> *)&entry_data._M_str,
               (unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)&local_80
              );
    std::unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_>::~unique_ptr
              ((unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)&local_80
              );
    if (entry_data._M_str == (char *)0x0) {
      iVar5 = -1;
    }
    else {
      std::__shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2> *)
                 &output_dir._M_cmpts,
                 (__shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2> *)&entry_data._M_str)
      ;
      mg::data::MappedHfa::parse
                ((MappedHfa *)
                 &hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(shared_ptr<mg::fs::MappedFile> *)&output_dir._M_cmpts);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
      if (hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar5 = -1;
      }
      else {
        local_80._M_pathname._M_dataplus._M_p = ".";
        if (pcVar7 != (char *)0x0) {
          local_80._M_pathname._M_dataplus._M_p = pcVar7;
        }
        std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                  ((path *)local_b8,(char **)&local_80,auto_format);
        bVar1 = std::filesystem::exists((path *)local_b8);
        if ((bVar1) ||
           (cVar2 = std::filesystem::create_directories((path *)local_b8), cVar2 != '\0')) {
          iVar5 = 0;
          for (uVar6 = 0;
              uVar6 < (ulong)(*(long *)&hfa_data.
                                        super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi[1]._M_use_count -
                              (long)hfa_data.
                                    super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi[1]._vptr__Sp_counted_base >> 7);
              uVar6 = uVar6 + 1) {
            _local_58 = mg::data::MappedHfa::entry_data
                                  ((MappedHfa *)
                                   hfa_data.
                                   super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi,(int)uVar6);
            std::filesystem::__cxx11::path::path(&local_80,(path *)local_b8);
            __source = std::
                       vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
                       ::at((vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
                             *)(hfa_data.
                                super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi + 1),uVar6 & 0xffffffff);
            std::filesystem::__cxx11::path::append<char[96]>(&local_80,__source->filename);
            bVar1 = mg::fs::write_file(local_80._M_pathname._M_dataplus._M_p,(string_view *)local_58
                                      );
            if (bVar1) {
              fprintf(_stderr,"Wrote %lu bytes to %s\n",local_58,
                      local_80._M_pathname._M_dataplus._M_p);
            }
            std::filesystem::__cxx11::path::~path(&local_80);
          }
        }
        else {
          fprintf(_stderr,"Failed to create output path \'%s\'\n",local_b8);
          iVar5 = -1;
        }
        std::filesystem::__cxx11::path::~path((path *)local_b8);
      }
      std::unique_ptr<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>_>::~unique_ptr
                ((unique_ptr<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>_> *)
                 &hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&hfa_data);
    return iVar5;
  }
LAB_001045f4:
  usage(*argv);
  return -1;
}

Assistant:

int main(int argc, char **argv) {
  // Parse args
  const char *input_basename = nullptr;
  const char *output_path = nullptr;
  for (int i = 1; i < argc; i++) {
    // Basename?
    if (input_basename == nullptr) {
      input_basename = argv[i];
      continue;
    }

    // Output dir?
    if (output_path == nullptr) {
      output_path = argv[i];
      continue;
    }

    // Invalid state
    usage(argv[0]);
    return -1;
  }

  // Check args are OK
  if (input_basename == nullptr) {
    usage(argv[0]);
    return -1;
  }

  // Map the file
  std::shared_ptr<mg::fs::MappedFile> hfa_data =
      mg::fs::MappedFile::open(input_basename);
  if (hfa_data == nullptr) {
    return -1;
  }

  // Parse the data
  auto hfa = mg::data::MappedHfa::parse(hfa_data);
  if (hfa == nullptr) {
    return -1;
  }

  // Ensure output dir exists
  std::filesystem::path output_dir = output_path ? output_path : ".";
  if (!std::filesystem::exists(output_dir) &&
      !std::filesystem::create_directories(output_dir)) {
    fprintf(stderr, "Failed to create output path '%s'\n", output_dir.c_str());
    return -1;
  }

  // Utility method to write an index to an output file
  auto write_entry = [&](unsigned index) -> int {
    auto entry_data = hfa->entry_data(index);
    std::filesystem::path output_path = output_dir;
    output_path.append(hfa->entries().at(index).filename);
    if (!mg::fs::write_file(output_path.c_str(), entry_data)) {
      return -1;
    }
    fprintf(stderr, "Wrote %lu bytes to %s\n", entry_data.size(),
            output_path.c_str());

    return 0;
  };

  // Iterate the mrg entries and emit
  for (std::vector<std::string>::size_type i = 0; i < hfa->entries().size();
       i++) {
    write_entry(i);
  }

  return 0;
}